

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t XXH3_len_4to8_128b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  xxh_u32 xVar1;
  xxh_u32 xVar2;
  xxh_u32 xVar3;
  xxh_u64 xVar4;
  xxh_u64 xVar5;
  XXH64_hash_t XVar6;
  ulong in_RCX;
  long in_RSI;
  XXH128_hash_t XVar7;
  xxh_u64 keyed;
  xxh_u64 bitflip;
  xxh_u64 input_64;
  xxh_u32 input_hi;
  xxh_u32 input_lo;
  XXH128_hash_t m128;
  undefined4 local_30;
  undefined1 local_10 [16];
  
  local_30 = (xxh_u32)in_RCX;
  xVar1 = XXH_swap32(local_30);
  xVar2 = XXH_readLE32((void *)0x2c9f5e);
  xVar3 = XXH_readLE32((void *)0x2c9f76);
  xVar4 = XXH_readLE64((void *)0x2c9f9c);
  xVar5 = XXH_readLE64((void *)0x2c9fae);
  XVar7 = XXH_mult64to128(CONCAT44(xVar3,xVar2) ^ (xVar4 ^ xVar5) + (in_RCX ^ (ulong)xVar1 << 0x20),
                          in_RSI * 4 + 0x9e3779b185ebca87);
  local_10._0_8_ = XVar7.low64;
  local_10._8_8_ = XVar7.high64;
  xVar4 = XXH_xorshift64(local_10._0_8_ ^ (ulong)(local_10._8_8_ + local_10._0_8_ * 2) >> 3,0x23);
  xVar4 = XXH_xorshift64(xVar4 * -0x604de39ae16720db,0x1c);
  XVar6 = XXH3_avalanche(0x2ca071);
  XVar7.low64 = xVar4;
  XVar7.high64 = XVar6;
  return XVar7;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH3_len_4to8_128b(const xxh_u8* input, size_t len, const xxh_u8* secret, XXH64_hash_t seed)
{
    XXH_ASSERT(input != NULL);
    XXH_ASSERT(secret != NULL);
    XXH_ASSERT(4 <= len && len <= 8);
    seed ^= (xxh_u64)XXH_swap32((xxh_u32)seed) << 32;
    {   xxh_u32 const input_lo = XXH_readLE32(input);
        xxh_u32 const input_hi = XXH_readLE32(input + len - 4);
        xxh_u64 const input_64 = input_lo + ((xxh_u64)input_hi << 32);
        xxh_u64 const bitflip = (XXH_readLE64(secret+16) ^ XXH_readLE64(secret+24)) + seed;
        xxh_u64 const keyed = input_64 ^ bitflip;

        /* Shift len to the left to ensure it is even, this avoids even multiplies. */
        XXH128_hash_t m128 = XXH_mult64to128(keyed, XXH_PRIME64_1 + (len << 2));

        m128.high64 += (m128.low64 << 1);
        m128.low64  ^= (m128.high64 >> 3);

        m128.low64   = XXH_xorshift64(m128.low64, 35);
        m128.low64  *= 0x9FB21C651E98DF25ULL;
        m128.low64   = XXH_xorshift64(m128.low64, 28);
        m128.high64  = XXH3_avalanche(m128.high64);
        return m128;
    }
}